

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
* __thiscall
node::anon_unknown_2::NodeImpl::getNetLocalAddresses
          (map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
           *__return_storage_ptr__,NodeImpl *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  CConnman *this_00;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->m_context->connman)._M_t.
            super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
            super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
            super__Head_base<0UL,_CConnman_*,_false>._M_head_impl;
  if (this_00 == (CConnman *)0x0) {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00257efc;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
LAB_00257efc:
      __stack_chk_fail();
    }
    CConnman::getNetLocalAddresses(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<CNetAddr, LocalServiceInfo> getNetLocalAddresses() override
    {
        if (m_context->connman)
            return m_context->connman->getNetLocalAddresses();
        else
            return {};
    }